

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

void uv_fs_req_cleanup(uv_fs_t *req)

{
  long in_RDI;
  
  free(*(void **)(in_RDI + 0x48));
  *(undefined8 *)(in_RDI + 0x48) = 0;
  *(undefined8 *)(in_RDI + 0xf0) = 0;
  if (*(long *)(in_RDI + 0x40) != in_RDI + 0x50) {
    free(*(void **)(in_RDI + 0x40));
  }
  *(undefined8 *)(in_RDI + 0x40) = 0;
  return;
}

Assistant:

void uv_fs_req_cleanup(uv_fs_t* req) {
  free((void*) req->path);
  req->path = NULL;
  req->new_path = NULL;

  if (req->ptr != &req->statbuf)
    free(req->ptr);
  req->ptr = NULL;
}